

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.hh
# Opt level: O3

system_t * __thiscall tchecker::system::system_t::operator=(system_t *this,system_t *param_1)

{
  clock_variables_t *pcVar1;
  clock_variables_t *pcVar2;
  integer_variables_t *piVar3;
  integer_variables_t *piVar4;
  uint uVar5;
  
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this,(variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)param_1);
  uVar5 = (param_1->super_clocks_t)._clock_variables.
          super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._next_id;
  (this->super_clocks_t)._clock_variables.
  super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._first_id = (param_1->super_clocks_t)._clock_variables.
               super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._first_id;
  (this->super_clocks_t)._clock_variables.
  super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._next_id = uVar5;
  variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->super_clocks_t)._clock_variables.
                  super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._flattened_variables,
              (variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(param_1->super_clocks_t)._clock_variables.
                  super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._flattened_variables);
  pcVar1 = &(param_1->super_clocks_t)._clock_variables;
  uVar5 = (pcVar1->
          super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._flattened_variables.
          super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._next_id;
  pcVar2 = &(this->super_clocks_t)._clock_variables;
  (pcVar2->
  super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._flattened_variables.
  super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._first_id = (pcVar1->
               super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._flattened_variables.
               super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._first_id;
  (pcVar2->
  super_array_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._flattened_variables.
  super_size_variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._next_id = uVar5;
  std::vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
  operator=(&(this->super_clocks_t)._clock_variables_attributes,
            &(param_1->super_clocks_t)._clock_variables_attributes);
  edges_t::operator=(&this->super_edges_t,&param_1->super_edges_t);
  std::vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
  operator=(&(this->super_events_t)._events_attributes,&(param_1->super_events_t)._events_attributes
           );
  index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::operator=(&(this->super_events_t)._events_index,&(param_1->super_events_t)._events_index);
  variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&this->super_intvars_t,
              (variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&param_1->super_intvars_t);
  uVar5 = (param_1->super_intvars_t)._integer_variables.
          super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._next_id;
  (this->super_intvars_t)._integer_variables.
  super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._first_id = (param_1->super_intvars_t)._integer_variables.
               super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._first_id;
  (this->super_intvars_t)._integer_variables.
  super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._next_id = uVar5;
  variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(this->super_intvars_t)._integer_variables.
                  super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._flattened_variables,
              (variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(param_1->super_intvars_t)._integer_variables.
                  super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._flattened_variables);
  piVar3 = &(param_1->super_intvars_t)._integer_variables;
  uVar5 = (piVar3->
          super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._flattened_variables.
          super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._next_id;
  piVar4 = &(this->super_intvars_t)._integer_variables;
  (piVar4->
  super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._flattened_variables.
  super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._first_id = (piVar3->
               super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._flattened_variables.
               super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._first_id;
  (piVar4->
  super_array_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._flattened_variables.
  super_size_variables_t<unsigned_int,_tchecker::intvar_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._next_id = uVar5;
  std::vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
  operator=(&(this->super_intvars_t)._integer_variables_attributes,
            &(param_1->super_intvars_t)._integer_variables_attributes);
  locs_t::operator=(&this->super_locs_t,&param_1->super_locs_t);
  std::vector<tchecker::system::attributes_t,_std::allocator<tchecker::system::attributes_t>_>::
  operator=(&(this->super_processes_t)._procs_attributes,
            &(param_1->super_processes_t)._procs_attributes);
  index_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::operator=(&(this->super_processes_t)._procs_index,&(param_1->super_processes_t)._procs_index);
  std::
  vector<tchecker::system::synchronization_t,_std::allocator<tchecker::system::synchronization_t>_>
  ::operator=(&(this->super_synchronizations_t)._syncs,&(param_1->super_synchronizations_t)._syncs);
  std::__cxx11::string::_M_assign((string *)&this->_name);
  if (param_1 != this) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,tchecker::system::attr_t>,std::allocator<std::pair<std::__cxx11::string_const,tchecker::system::attr_t>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,false>>
                *)&this->_attributes,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tchecker::system::attr_t>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                *)&param_1->_attributes);
  }
  return this;
}

Assistant:

tchecker::system::system_t & operator=(tchecker::system::system_t const &) = default;